

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typesystem_parser.cpp
# Opt level: O1

void __thiscall franca::TypeParser::TypeParser(TypeParser *this)

{
  Rule<ast::Type_()> *pRVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uVar5;
  Rule<ast::IntegerInterval_()> *pRVar6;
  adder *paVar7;
  parser_binder<boost::spirit::qi::raw_directive<boost::spirit::qi::list<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>_>,_mpl_::bool_<true>_>
  f;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[8]>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>
  that_2;
  string local_150;
  BuiltinType local_12c;
  BuiltinType local_128;
  undefined1 local_124 [12];
  Rule<std::string_()> *local_118;
  symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>
  *local_110;
  Rule<ast::IntegerInterval_()> *local_108;
  char *****local_100;
  undefined1 **local_f8;
  BuiltinType *****local_f0;
  undefined1 **local_e8;
  char *****local_e0;
  char *****local_d8;
  Rule<std::string_()> *local_d0;
  Rule<ast::Type_()> *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  string *local_b8;
  BuiltinType *****local_b0;
  char ****local_a8;
  char ****local_a0;
  char *****local_98;
  char ******local_90;
  char *****local_88;
  undefined1 *local_80;
  char **local_78;
  BuiltinType local_70 [4];
  char ***local_60;
  BuiltinType *local_58;
  BuiltinType local_50 [4];
  char *local_40;
  BuiltinType *local_38;
  
  paVar4 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"unnamed-grammar","");
  pRVar1 = &this->type_;
  (this->
  super_grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pRVar1;
  psVar2 = &(this->
            super_grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
            ).name_;
  paVar3 = &(this->
            super_grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
            ).name_.field_2;
  (this->
  super_grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).name_._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar2,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar4) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar4;
  local_c0 = paVar3;
  local_b8 = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"unnamed-rule","");
  (this->type_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pRVar1;
  (this->type_).name_._M_dataplus._M_p = (pointer)&(this->type_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->type_).name_,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  (this->type_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar4) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar4;
  local_c8 = pRVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"unnamed-rule","");
  (this->type_ref_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->type_ref_;
  (this->type_ref_).name_._M_dataplus._M_p = (pointer)&(this->type_ref_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->type_ref_).name_,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  (this->type_ref_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar4) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar4;
  local_d0 = &this->type_ref_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"unnamed-rule","");
  local_108 = &this->integer_interval_;
  (this->integer_interval_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_108;
  (this->integer_interval_).name_._M_dataplus._M_p =
       (pointer)&(this->integer_interval_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->integer_interval_).name_,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  (this->integer_interval_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<fidler::ast::IntegerInterval_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar4) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"symbols","");
  local_110 = &this->builtin_type_;
  boost::spirit::qi::
  symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>
  ::symbols(local_110,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar4) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"unnamed-rule","");
  local_118 = &this->fqn_;
  (this->fqn_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_118;
  (this->fqn_).name_._M_dataplus._M_p = (pointer)&(this->fqn_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->fqn_).name_,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  (this->fqn_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar4) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"unnamed-rule","");
  local_124._4_8_ = &this->id_;
  (this->id_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_124._4_8_;
  (this->id_).name_._M_dataplus._M_p = (pointer)&(this->id_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->id_).name_,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  (this->id_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar4) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  pRVar6 = local_108;
  local_150.field_2._M_allocated_capacity =
       (size_type)
       (local_118->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_150._M_string_length =
       (size_type)
       (local_110->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_150._M_dataplus._M_p =
       (pointer)(local_108->
                super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                ).proto_expr_.child0.ref.t_;
  boost::
  function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<boost::variant<fidler::ast::BuiltinType,fidler::ast::IntegerInterval,std::__cxx11::string>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::reference<boost::spirit::qi::rule<char_const*,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>const>const&)>
  ::operator=((function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<boost::variant<fidler::ast::BuiltinType,fidler::ast::IntegerInterval,std::__cxx11::string>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::reference<boost::spirit::qi::rule<char_const*,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>const>const&)>
               *)&(this->type_).f,
              (parser_binder<boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
               *)&local_150);
  local_150._M_dataplus._M_p = (pointer)&local_90;
  local_90 = (char ******)0x3f62a8;
  local_a0 = (char ****)local_124;
  local_124[0] = 0x28;
  local_58 = local_70;
  local_70[0] = undefined;
  local_70[1] = 0x80000000;
  local_a8 = &local_60;
  local_60 = (char ***)0x3f62b0;
  local_98 = (char *****)&local_b0;
  local_b0 = (BuiltinType *****)&boost::spirit::long_long;
  local_100 = &local_a0;
  local_f8 = (undefined1 **)&local_128;
  local_128 = CONCAT31(local_128._1_3_,0x2c);
  local_f0 = (BuiltinType *****)&local_100;
  local_38 = local_50;
  local_50[0] = ~undefined;
  local_50[1] = 0x7fffffff;
  local_78 = &local_40;
  local_40 = "maxInt";
  local_e8 = &local_80;
  local_80 = &boost::spirit::long_long;
  local_e0 = (char *****)&local_f0;
  local_d8 = (char *****)&local_12c;
  local_12c = CONCAT31(local_12c._1_3_,0x29);
  local_150._M_string_length = (size_type)&local_e0;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::IntegerInterval(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[8]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::long_long>const&,boost::proto::exprns_::expr<boost::proto::tagns_::t___pr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,2l>>
            (pRVar6);
  local_150._M_dataplus._M_p = local_150._M_dataplus._M_p & 0xffffffff00000000;
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(&(this->builtin_type_).add,(char (*) [10])"undefined",
                               (BuiltinType *)&local_150);
  local_90 = (char ******)CONCAT44(local_90._4_4_,1);
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [5])0x3f484c,(BuiltinType *)&local_90);
  local_e0 = (char *****)CONCAT44(local_e0._4_4_,2);
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [6])"UInt8",(BuiltinType *)&local_e0);
  local_f0 = (BuiltinType *****)CONCAT44(local_f0._4_4_,3);
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [6])0x3f4852,(BuiltinType *)&local_f0);
  local_100 = (char *****)CONCAT44(local_100._4_4_,4);
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [7])"UInt16",(BuiltinType *)&local_100);
  local_a0 = (char ****)CONCAT44(local_a0._4_4_,5);
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [6])0x3f4859,(BuiltinType *)&local_a0);
  local_b0 = (BuiltinType *****)CONCAT44(local_b0._4_4_,6);
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [7])"UInt32",(BuiltinType *)&local_b0);
  local_60 = (char ***)CONCAT44(local_60._4_4_,7);
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [6])0x3f4860,(BuiltinType *)&local_60);
  local_70[0] = 8;
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [7])"UInt64",local_70);
  local_80 = (undefined1 *)CONCAT44(local_80._4_4_,9);
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [8])"Boolean",(BuiltinType *)&local_80);
  local_40 = (char *)CONCAT44(local_40._4_4_,10);
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [7])"String",(BuiltinType *)&local_40);
  local_50[0] = 0xb;
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [6])"Float",local_50);
  local_124._0_4_ = Double;
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [7])"Double",(BuiltinType *)local_124);
  local_128 = ByteBuffer;
  paVar7 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar7,(char (*) [11])"ByteBuffer",&local_128);
  local_12c = Int32;
  boost::spirit::qi::
  symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
  ::adder::operator()(paVar7,(char (*) [8])"Integer",&local_12c);
  uVar5 = local_124._4_8_;
  f.p.subject._8_8_ = 0x2e;
  f.p.subject.left.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )(((extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
              *)local_124._4_8_)->proto_expr_).child0.ref.t_;
  boost::
  function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::reference<boost::spirit::qi::rule<char_const*,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>const>const&)>
  ::operator=((function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::reference<boost::spirit::qi::rule<char_const*,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>const>const&)>
               *)&(this->fqn_).f,f);
  local_60 = (char ***)CONCAT71(local_60._1_7_,0x5e);
  local_70[0]._0_1_ = 0x5f;
  local_f0 = (BuiltinType *****)&boost::spirit::standard::alpha;
  local_e0 = &local_a0;
  local_d8 = (char *****)&local_f0;
  local_80 = (undefined1 *)CONCAT71(local_80._1_7_,0x5f);
  local_100 = (char *****)&boost::spirit::standard::alnum;
  local_b0 = (BuiltinType *****)&local_100;
  local_90 = &local_e0;
  local_88 = (char *****)&local_b0;
  local_150._M_dataplus._M_p = "";
  local_150._M_string_length = (size_type)&local_90;
  local_f8 = &local_80;
  local_e8 = (undefined1 **)local_70;
  local_a0 = &local_60;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,boost::spirit::char_encoding::standard>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,boost::spirit::char_encoding::standard>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,1l>const&>,2l>const&>,2l>>
            (uVar5);
  return;
}

Assistant:

TypeParser::TypeParser() :
		TypeParser::base_type(type_)
{
	namespace qi = boost::spirit::qi;

	type_
		%= integer_interval_
		| builtin_type_
		| fqn_
		;

	integer_interval_
		%= qi::lit("Integer")
		>> ( '('
		   > (qi::long_long | "minInt" >> qi::attr(LLONG_MIN))
		   > ','
		   > (qi::long_long | "maxInt" >> qi::attr(LLONG_MAX))
		   > ')'
		   )
		;

	builtin_type_.add
		("undefined",  ast::BuiltinType::undefined)
		("Int8",       ast::BuiltinType::Int8)
		("UInt8",      ast::BuiltinType::UInt8)
		("Int16",      ast::BuiltinType::Int16)
		("UInt16",     ast::BuiltinType::UInt16)
		("Int32",      ast::BuiltinType::Int32)
		("UInt32",     ast::BuiltinType::UInt32)
		("Int64",      ast::BuiltinType::Int64)
		("UInt64",     ast::BuiltinType::UInt64)
		("Boolean",    ast::BuiltinType::Boolean)
		("String",     ast::BuiltinType::String)
		("Float",      ast::BuiltinType::Float)
		("Double",     ast::BuiltinType::Double)
		("ByteBuffer", ast::BuiltinType::ByteBuffer)
		("Integer",    ast::BuiltinType::Int32)
		;

	fqn_
		%= qi::raw[id_ % '.']
		;

	id_
		%= qi::lexeme[-qi::lit('^') >> (qi::alpha | '_') >> *(qi::alnum | '_')]
		;
}